

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_fee.cpp
# Opt level: O0

void __thiscall
FeeCalculator_GetFeeTest_Test::~FeeCalculator_GetFeeTest_Test(FeeCalculator_GetFeeTest_Test *this)

{
  void *in_RDI;
  
  ~FeeCalculator_GetFeeTest_Test((FeeCalculator_GetFeeTest_Test *)0x20b3e8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(FeeCalculator, GetFeeTest)
{
  FeeCalculator fee(2000);
  size_t size = 3000;
  Amount amt;
  EXPECT_NO_THROW((amt = fee.GetFee(size)));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(6000));

  FeeCalculator fee2(20000);
  EXPECT_NO_THROW((amt = fee2.GetFee(size)));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(60000));
}